

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O2

void __thiscall
btCollisionWorld::addCollisionObject
          (btCollisionWorld *this,btCollisionObject *collisionObject,short collisionFilterGroup,
          short collisionFilterMask)

{
  btCollisionObject *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  btCollisionObject *collisionObject_local;
  btVector3 maxAabb;
  btVector3 minAabb;
  btTransform trans;
  
  collisionObject_local = collisionObject;
  btAlignedObjectArray<btCollisionObject_*>::push_back
            (&this->m_collisionObjects,&collisionObject_local);
  trans.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(collisionObject_local->m_worldTransform).m_basis.m_el[0].m_floats;
  trans.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((collisionObject_local->m_worldTransform).m_basis.m_el[0].m_floats + 2);
  trans.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(collisionObject_local->m_worldTransform).m_basis.m_el[1].m_floats;
  trans.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((collisionObject_local->m_worldTransform).m_basis.m_el[1].m_floats + 2);
  trans.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(collisionObject_local->m_worldTransform).m_basis.m_el[2].m_floats;
  trans.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((collisionObject_local->m_worldTransform).m_basis.m_el[2].m_floats + 2);
  trans.m_origin.m_floats[0] = (collisionObject_local->m_worldTransform).m_origin.m_floats[0];
  trans.m_origin.m_floats[1] = (collisionObject_local->m_worldTransform).m_origin.m_floats[1];
  trans.m_origin.m_floats[2] = (collisionObject_local->m_worldTransform).m_origin.m_floats[2];
  trans.m_origin.m_floats[3] = (collisionObject_local->m_worldTransform).m_origin.m_floats[3];
  (*collisionObject_local->m_collisionShape->_vptr_btCollisionShape[2])
            (collisionObject_local->m_collisionShape,&trans,&minAabb,&maxAabb);
  pbVar1 = collisionObject_local;
  iVar2 = (*this->m_broadphasePairCache->_vptr_btBroadphaseInterface[2])
                    (this->m_broadphasePairCache,&minAabb,&maxAabb,
                     (ulong)(uint)collisionObject_local->m_collisionShape->m_shapeType,
                     collisionObject_local,
                     CONCAT62(in_register_00000012,collisionFilterGroup) & 0xffffffff,
                     CONCAT62(in_register_0000000a,collisionFilterMask) & 0xffffffff,
                     this->m_dispatcher1,0);
  pbVar1->m_broadphaseHandle = (btBroadphaseProxy *)CONCAT44(extraout_var,iVar2);
  return;
}

Assistant:

void	btCollisionWorld::addCollisionObject(btCollisionObject* collisionObject,short int collisionFilterGroup,short int collisionFilterMask)
{

	btAssert(collisionObject);

	//check that the object isn't already added
	btAssert( m_collisionObjects.findLinearSearch(collisionObject)  == m_collisionObjects.size());

	m_collisionObjects.push_back(collisionObject);

	//calculate new AABB
	btTransform trans = collisionObject->getWorldTransform();

	btVector3	minAabb;
	btVector3	maxAabb;
	collisionObject->getCollisionShape()->getAabb(trans,minAabb,maxAabb);

	int type = collisionObject->getCollisionShape()->getShapeType();
	collisionObject->setBroadphaseHandle( getBroadphase()->createProxy(
		minAabb,
		maxAabb,
		type,
		collisionObject,
		collisionFilterGroup,
		collisionFilterMask,
		m_dispatcher1,0
		))	;





}